

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BroadcastReceiver.h
# Opt level: O2

void __thiscall
aeron::concurrent::broadcast::BroadcastReceiver::BroadcastReceiver
          (BroadcastReceiver *this,AtomicBuffer *buffer)

{
  length_t lVar1;
  int64_t iVar2;
  IllegalStateException *this_00;
  char *pcVar3;
  uint __val;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  this->m_buffer = buffer;
  lVar1 = buffer->m_length;
  __val = lVar1 - 0x80;
  this->m_capacity = __val;
  this->m_mask = lVar1 - 0x81;
  this->m_tailIntentCounterIndex = __val;
  this->m_tailCounterIndex = lVar1 - 0x78;
  this->m_latestCounterIndex = lVar1 - 0x70;
  *(undefined8 *)&this->m_recordOffset = 0;
  *(undefined8 *)((long)&this->m_cursor + 4) = 0;
  this->m_nextRecord = 0;
  (this->m_lappedCount).super___atomic_base<long>._M_i = 0;
  if ((0x80 < (int)lVar1) && ((lVar1 + 0x7fffff7f & __val) == 0)) {
    iVar2 = *(int64_t *)(buffer->m_buffer + (lVar1 - 0x70));
    this->m_cursor = iVar2;
    this->m_nextRecord = iVar2;
    this->m_recordOffset = lVar1 - 0x81 & (uint)iVar2;
    return;
  }
  this_00 = (IllegalStateException *)__cxa_allocate_exception(0x48);
  std::__cxx11::to_string(&local_58,__val);
  std::operator+(&local_38,"capacity must be a positive power of 2 + TRAILER_LENGTH: capacity=",
                 &local_58);
  std::__cxx11::string::string
            ((string *)&local_78,
             "void aeron::concurrent::broadcast::BroadcastBufferDescriptor::checkCapacity(util::index_t)"
             ,&local_99);
  pcVar3 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                             ,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/broadcast/BroadcastBufferDescriptor.h"
                            );
  std::__cxx11::string::string((string *)&local_98,pcVar3,&local_9a);
  util::IllegalStateException::IllegalStateException(this_00,&local_38,&local_78,&local_98,0x27);
  __cxa_throw(this_00,&util::IllegalStateException::typeinfo,
              util::SourcedException::~SourcedException);
}

Assistant:

BroadcastReceiver(AtomicBuffer& buffer) :
        m_buffer(buffer),
        m_capacity(buffer.capacity() - BroadcastBufferDescriptor::TRAILER_LENGTH),
        m_mask(m_capacity - 1),
        m_tailIntentCounterIndex(m_capacity + BroadcastBufferDescriptor::TAIL_INTENT_COUNTER_OFFSET),
        m_tailCounterIndex(m_capacity + BroadcastBufferDescriptor::TAIL_COUNTER_OFFSET),
        m_latestCounterIndex(m_capacity + BroadcastBufferDescriptor::LATEST_COUNTER_OFFSET),
        m_recordOffset(0),
        m_cursor(0),
        m_nextRecord(0),
        m_lappedCount(0)
    {
        BroadcastBufferDescriptor::checkCapacity(m_capacity);

        m_cursor = m_buffer.getInt64(m_latestCounterIndex);
        m_nextRecord = m_cursor;
        m_recordOffset = (std::int32_t)m_cursor & m_mask;
    }